

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.H
# Opt level: O1

void __thiscall
Fl_Help_Font_Stack::pop(Fl_Help_Font_Stack *this,Fl_Font *f,Fl_Fontsize *s,Fl_Color *c)

{
  size_t sVar1;
  
  if (this->nfonts_ != 0) {
    this->nfonts_ = this->nfonts_ - 1;
  }
  sVar1 = this->nfonts_;
  *f = this->elts_[sVar1].f;
  *s = this->elts_[sVar1].s;
  *c = this->elts_[sVar1].c;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)*f,(ulong)(uint)*s);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)*c);
  return;
}

Assistant:

void pop(Fl_Font &f, Fl_Fontsize &s, Fl_Color &c) { 
    if (nfonts_ > 0) nfonts_ --;
    top(f, s, c);
    fl_font(f, s); fl_color(c);
  }